

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall
GdlBinaryExpression::GenerateSetBitsOp
          (GdlBinaryExpression *this,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int iritCurrent,
          vector<int,_std::allocator<int>_> *pviritInput,int nIIndex,bool fAttachAt,int iritAttachTo
          )

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  char cVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  value_type_conflict4 local_ad;
  int nMask;
  int nValue;
  int local_a4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  string staOp12;
  string staOp1;
  string staOp;
  
  local_a4 = nIIndex;
  GrcSymbolTableEntry::FullName_abi_cxx11_(&staOp,this->m_psymOperator);
  iVar3 = std::__cxx11::string::compare((char *)&staOp);
  if (iVar3 == 0) {
    local_98 = pviritInput;
    if (this->m_pexpOperand1 == (GdlExpression *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(this->m_pexpOperand1,&GdlExpression::typeinfo,&typeinfo,0);
    }
    if (this->m_pexpOperand2 == (GdlExpression *)0x0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(this->m_pexpOperand2,&GdlExpression::typeinfo,
                                      &GdlNumericExpression::typeinfo,0);
    }
    if (plVar5 != (long *)0x0 && lVar4 != 0) {
      GrcSymbolTableEntry::FullName_abi_cxx11_(&staOp1,*(GrcSymbolTableEntry **)(lVar4 + 0x38));
      local_a0 = vbOutput;
      if (*(long *)(lVar4 + 0x48) == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(*(long *)(lVar4 + 0x48),&GdlExpression::typeinfo,
                               &GdlUnaryExpression::typeinfo,0);
      }
      iVar3 = std::__cxx11::string::compare((char *)&staOp1);
      if ((iVar3 == 0) && (lVar6 != 0)) {
        GrcSymbolTableEntry::FullName_abi_cxx11_(&staOp12,*(GrcSymbolTableEntry **)(lVar6 + 0x38));
        iVar3 = std::__cxx11::string::compare((char *)&staOp12);
        if (iVar3 == 0) {
          cVar1 = (**(code **)(**(long **)(lVar6 + 0x40) + 0x38))(*(long **)(lVar6 + 0x40),&nMask,0)
          ;
          this_00 = local_a0;
          if (cVar1 != '\0') {
            bVar2 = (**(code **)(*plVar5 + 0x38))(plVar5,&nValue,0);
            if ((bVar2 & nMask < 0x10000) == 1) {
              (**(code **)(**(long **)(lVar4 + 0x40) + 0xe0))
                        (*(long **)(lVar4 + 0x40),fxdRuleVersion,this_00,iritCurrent,local_98,
                         local_a4,fAttachAt,iritAttachTo,0);
              local_ad = 'A';
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (this_00,&local_ad);
              local_ad = nMask._1_1_;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (this_00,&local_ad);
              local_ad = (value_type_conflict4)nMask;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (this_00,&local_ad);
              local_ad = nValue._1_1_;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (this_00,&local_ad);
              local_ad = (value_type_conflict4)nValue;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (this_00,&local_ad);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)staOp12._M_dataplus._M_p != &staOp12.field_2) {
                operator_delete(staOp12._M_dataplus._M_p,staOp12.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)staOp1._M_dataplus._M_p != &staOp1.field_2) {
                operator_delete(staOp1._M_dataplus._M_p,staOp1.field_2._M_allocated_capacity + 1);
              }
              bVar7 = true;
              goto LAB_00155d1a;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)staOp12._M_dataplus._M_p != &staOp12.field_2) {
          operator_delete(staOp12._M_dataplus._M_p,staOp12.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)staOp1._M_dataplus._M_p != &staOp1.field_2) {
        operator_delete(staOp1._M_dataplus._M_p,staOp1.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar7 = false;
LAB_00155d1a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)staOp._M_dataplus._M_p != &staOp.field_2) {
    operator_delete(staOp._M_dataplus._M_p,staOp.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool GdlBinaryExpression::GenerateSetBitsOp(uint32_t fxdRuleVersion, std::vector<gr::byte> & vbOutput,
	int iritCurrent, std::vector<int> * pviritInput, int nIIndex,
	bool fAttachAt, int iritAttachTo)
{
	std::string staOp = m_psymOperator->FullName();
	if (staOp == "|")
	{
		GdlBinaryExpression * pexp1And = dynamic_cast<GdlBinaryExpression *>(m_pexpOperand1);
		GdlNumericExpression * pexp2Value = dynamic_cast<GdlNumericExpression *>(m_pexpOperand2);
		if (pexp1And && pexp2Value)
		{
			std::string staOp1 = pexp1And->Operator()->FullName();
			GdlUnaryExpression * pexp1And2Not = dynamic_cast<GdlUnaryExpression *>(pexp1And->Operand2());
			if (staOp1 == "&" && pexp1And2Not)
			{
				std::string staOp12 = pexp1And2Not->Operator()->FullName();
				if (staOp12 == "~")
				{
					int nMask, nValue;
					if (pexp1And2Not->Operand()->ResolveToInteger(&nMask, false)
						&& pexp2Value->ResolveToInteger(&nValue, false)
						&& nMask <= 0xFFFF)
					{
						// Okay, it's the right form.
						pexp1And->Operand1()->GenerateEngineCode(fxdRuleVersion, vbOutput, iritCurrent,
							pviritInput, nIIndex, fAttachAt, iritAttachTo, NULL);
						vbOutput.push_back(kopSetBits);
						vbOutput.push_back(nMask >> 8);
						vbOutput.push_back(nMask & 0x000000FF);
						vbOutput.push_back(nValue >> 8);
						vbOutput.push_back(nValue & 0x000000FF);
						return true;
					}
				}
			}
		}
	}
	
	return false;
}